

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O0

void __thiscall
wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
          (StructValuesMap<wasm::PossibleConstantValues> *this,
          StructValuesMap<wasm::PossibleConstantValues> *combinedInfos)

{
  bool bVar1;
  reference __in;
  type *ptVar2;
  vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_> *this_00;
  size_type sVar3;
  StructValues<wasm::PossibleConstantValues> *this_01;
  PossibleConstantValues *this_02;
  PossibleConstantValues *other;
  uint local_4c;
  Index i;
  type *info;
  type *type;
  _Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
  local_30;
  const_iterator __end0;
  const_iterator __begin0;
  StructValuesMap<wasm::PossibleConstantValues> *__range3;
  StructValuesMap<wasm::PossibleConstantValues> *combinedInfos_local;
  StructValuesMap<wasm::PossibleConstantValues> *this_local;
  
  __end0 = std::
           unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
           ::begin(&this->
                    super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                  );
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
       ::end(&this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
            );
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end0.
                        super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
                       ,&local_30);
    if (!bVar1) break;
    __in = std::__detail::
           _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>
           ::operator*(&__end0);
    ptVar2 = std::
             get<0ul,wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>
                       (__in);
    this_00 = &std::
               get<1ul,wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>
                         (__in)->
               super_vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>
    ;
    local_4c = 0;
    while( true ) {
      sVar3 = std::
              vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::
              size(this_00);
      if (sVar3 <= local_4c) break;
      this_01 = operator[](combinedInfos,(HeapType)ptVar2->id);
      this_02 = StructValues<wasm::PossibleConstantValues>::operator[](this_01,(ulong)local_4c);
      other = StructValues<wasm::PossibleConstantValues>::operator[]
                        ((StructValues<wasm::PossibleConstantValues> *)this_00,(ulong)local_4c);
      PossibleConstantValues::combine(this_02,other);
      local_4c = local_4c + 1;
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void combineInto(StructValuesMap<T>& combinedInfos) const {
    for (auto& [type, info] : *this) {
      for (Index i = 0; i < info.size(); i++) {
        combinedInfos[type][i].combine(info[i]);
      }
    }
  }